

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O1

void duckdb_brotli::BrotliZopfliCreateCommands
               (size_t num_bytes,size_t block_start,ZopfliNode *nodes,int *dist_cache,
               size_t *last_insert_len,BrotliEncoderParams *params,Command *commands,
               size_t *num_literals)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ushort uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  uint32_t uVar22;
  ulong uVar23;
  uint16_t *puVar24;
  bool bVar25;
  
  uVar8 = (nodes->u).next;
  if (uVar8 == 0xffffffff) {
    lVar10 = 0;
  }
  else {
    uVar20 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
    sVar2 = params->stream_offset;
    sVar3 = (params->dictionary).compound.total_size;
    puVar24 = &commands->dist_prefix_;
    lVar12 = 0;
    lVar10 = 0;
    do {
      uVar6 = (ulong)uVar8;
      uVar16 = nodes[lVar10 + uVar6].length;
      uVar17 = nodes[lVar10 + uVar6].dcode_insert_length;
      uVar18 = (ulong)(uVar17 & 0x7ffffff);
      uVar8 = nodes[lVar10 + uVar6].u.next;
      bVar25 = lVar12 == 0;
      lVar12 = lVar12 + -1;
      uVar9 = uVar18;
      if (bVar25) {
        uVar9 = *last_insert_len + uVar18;
        *last_insert_len = 0;
      }
      uVar13 = uVar16 & 0x1ffffff;
      uVar1 = nodes[lVar10 + uVar6].distance;
      iVar14 = uVar13 - (uVar16 >> 0x19);
      uVar15 = iVar14 + 9;
      uVar6 = block_start + sVar2 + lVar10 + uVar18;
      if (uVar20 <= uVar6) {
        uVar6 = uVar20;
      }
      uVar4 = (uVar17 >> 0x1b) - 1;
      if (uVar17 < 0x8000000) {
        uVar4 = uVar1 + 0xf;
      }
      ((Command *)(puVar24 + -7))->insert_len_ = (uint32_t)uVar9;
      *(uint *)(puVar24 + -5) = (uVar15 - uVar16) * 0x2000000 | uVar13;
      uVar23 = (ulong)(params->dist).num_direct_distance_codes;
      uVar21 = uVar23 + 0x10;
      if (uVar4 < uVar21) {
        *puVar24 = (ushort)uVar4;
        uVar22 = 0;
      }
      else {
        uVar22 = (params->dist).distance_postfix_bits;
        bVar7 = (byte)uVar22;
        uVar23 = ((uVar4 - uVar23) + (4L << (bVar7 & 0x3f))) - 0x10;
        uVar16 = 0x1f;
        if ((uint)uVar23 != 0) {
          for (; (uint)uVar23 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar16 = (uVar16 ^ 0xffffffe0) + 0x1f;
        bVar25 = (uVar23 >> ((ulong)uVar16 & 0x3f) & 1) != 0;
        iVar19 = uVar16 - uVar22;
        *puVar24 = (short)((uint)bVar25 + iVar19 * 2 + 0xfffe << (bVar7 & 0x3f)) +
                   (short)uVar21 + (~(ushort)(-1 << (bVar7 & 0x1f)) & (ushort)uVar23) |
                   (short)iVar19 * 0x400;
        uVar22 = (uint32_t)(uVar23 - ((ulong)bVar25 + 2 << ((byte)uVar16 & 0x3f)) >> (bVar7 & 0x3f))
        ;
      }
      *(uint32_t *)(puVar24 + -3) = uVar22;
      if (uVar9 < 6) {
        uVar21 = uVar9 & 0xffffffff;
      }
      else if (uVar9 < 0x82) {
        uVar16 = 0x1f;
        uVar17 = (uint)(uVar9 - 2);
        if (uVar17 != 0) {
          for (; uVar17 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar21 = (ulong)((int)(uVar9 - 2 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar16 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (uVar9 < 0x842) {
        uVar17 = (uint32_t)uVar9 - 0x42;
        uVar16 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar21 = (ulong)((uVar16 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar21 = 0x15;
        if (0x1841 < uVar9) {
          uVar21 = (ulong)(ushort)(0x17 - (uVar9 < 0x5842));
        }
      }
      if (uVar15 < 10) {
        uVar16 = iVar14 + 7;
      }
      else if (uVar15 < 0x86) {
        uVar17 = iVar14 + 3;
        uVar16 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar16 == 0; uVar16 = uVar16 - 1) {
          }
        }
        uVar16 = (int)((ulong)(long)(int)uVar17 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                 (uVar16 ^ 0xffffffe0) * 2 + 0x42;
      }
      else {
        uVar16 = 0x17;
        if (uVar15 < 0x846) {
          uVar16 = 0x1f;
          if (iVar14 - 0x3dU != 0) {
            for (; iVar14 - 0x3dU >> uVar16 == 0; uVar16 = uVar16 - 1) {
            }
          }
          uVar16 = (uVar16 ^ 0xffe0) + 0x2c;
        }
      }
      uVar5 = (ushort)uVar16;
      uVar11 = (uVar5 & 7) + ((ushort)uVar21 & 7) * 8;
      if ((((*puVar24 & 0x3ff) == 0) && ((ushort)uVar21 < 8)) && (uVar5 < 0x10)) {
        if (7 < uVar5) {
          uVar11 = uVar11 + 0x40;
        }
      }
      else {
        iVar14 = (int)((uVar21 & 0xffff) >> 3) * 3 + ((uVar16 & 0xffff) >> 3);
        uVar11 = uVar11 + ((ushort)(0x520d40 >> ((char)iVar14 * '\x02' & 0x1fU)) & 0xc0) +
                          (short)iVar14 * 0x40 + 0x40;
      }
      puVar24[-1] = uVar11;
      if (((ulong)uVar1 <= uVar6 + sVar3) && (uVar4 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar9;
      lVar10 = lVar10 + uVar18 + (ulong)uVar13;
      puVar24 = puVar24 + 8;
    } while (uVar8 != 0xffffffff);
  }
  *last_insert_len = *last_insert_len + (num_bytes - lVar10);
  return;
}

Assistant:

void duckdb_brotli::BrotliZopfliCreateCommands(const size_t num_bytes,
    const size_t block_start, const ZopfliNode* nodes, int* dist_cache,
    size_t* last_insert_len, const BrotliEncoderParams* params,
    Command* commands, size_t* num_literals) {
  const size_t stream_offset = params->stream_offset;
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  size_t pos = 0;
  uint32_t offset = nodes[0].u.next;
  size_t i;
  size_t gap = params->dictionary.compound.total_size;
  for (i = 0; offset != BROTLI_UINT32_MAX; i++) {
    const ZopfliNode* next = &nodes[pos + offset];
    size_t copy_length = ZopfliNodeCopyLength(next);
    size_t insert_length = next->dcode_insert_length & 0x7FFFFFF;
    pos += insert_length;
    offset = next->u.next;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    {
      size_t distance = ZopfliNodeCopyDistance(next);
      size_t len_code = ZopfliNodeLengthCode(next);
      size_t dictionary_start = BROTLI_MIN(size_t,
          block_start + pos + stream_offset, max_backward_limit);
      BROTLI_BOOL is_dictionary =
          TO_BROTLI_BOOL(distance > dictionary_start + gap);
      size_t dist_code = ZopfliNodeDistanceCode(next);
      InitCommand(&commands[i], &params->dist, insert_length,
          copy_length, (int)len_code - (int)copy_length, dist_code);

      if (!is_dictionary && dist_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = (int)distance;
      }
    }

    *num_literals += insert_length;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
}